

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

void lzma_decoder_reset(void *coder_ptr,void *opt)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint32_t i_1;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint32_t j;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  bVar3 = (byte)*(undefined4 *)((long)opt + 0x1c);
  uVar8 = -1 << (bVar3 & 0x1f);
  uVar9 = ~uVar8;
  *(uint *)((long)coder_ptr + 0x6e8c) = uVar9;
  iVar17 = *(int *)((long)opt + 0x14);
  iVar23 = *(int *)((long)opt + 0x18);
  uVar11 = iVar23 + iVar17;
  if (uVar11 < 5) {
    uVar6 = 0;
    pvVar12 = coder_ptr;
    do {
      lVar5 = 0;
      do {
        puVar1 = (undefined8 *)((long)pvVar12 + lVar5 * 2);
        *puVar1 = 0x400040004000400;
        puVar1[1] = 0x400040004000400;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x300);
      uVar6 = uVar6 + 1;
      pvVar12 = (void *)((long)pvVar12 + 0x600);
    } while (uVar6 >> ((byte)uVar11 & 0x1f) == 0);
    *(int *)((long)coder_ptr + 0x6e90) = iVar17;
    *(int *)((long)coder_ptr + 0x6e94) = ~(-1 << ((byte)iVar23 & 0x1f));
    *(undefined8 *)((long)coder_ptr + 0x6e78) = 0;
    *(undefined8 *)((long)coder_ptr + 0x6e80) = 0;
    *(undefined4 *)((long)coder_ptr + 0x6e88) = 0;
    *(uint *)((long)coder_ptr + 0x6e8c) = uVar9;
    *(undefined8 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
    *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
    lVar5 = (long)coder_ptr + 0x61e0;
    lVar4 = 0;
    do {
      uVar10 = 0;
      do {
        *(undefined2 *)(lVar5 + -0x1e0 + uVar10 * 2) = 0x400;
        *(undefined2 *)(lVar5 + uVar10 * 2) = 0x400;
        uVar10 = uVar10 + 1;
      } while (-uVar8 != uVar10);
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x6180) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x6198) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x61b0) = 0x400;
      *(undefined2 *)((long)coder_ptr + lVar4 * 2 + 0x61c8) = 0x400;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 != 0xc);
    lVar5 = (long)coder_ptr + 0x6360;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)(lVar5 + lVar7 * 2);
        *puVar1 = 0x400040004000400;
        puVar1[1] = 0x400040004000400;
        auVar2 = _DAT_00245110;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x40);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x80;
    } while (lVar4 != 4);
    lVar5 = 0;
    auVar13 = _DAT_00248a00;
    auVar14 = _DAT_00248a10;
    auVar15 = _DAT_00248a20;
    auVar16 = _DAT_00245100;
    do {
      auVar18 = auVar16 ^ auVar2;
      iVar17 = auVar18._0_4_;
      iVar23 = auVar18._8_4_;
      auVar24._4_4_ = iVar17;
      auVar24._0_4_ = iVar17;
      auVar24._8_4_ = iVar23;
      auVar24._12_4_ = iVar23;
      auVar28._0_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar28._4_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar28._8_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar28._12_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar19._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar19._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar19._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar19._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar19 = auVar19 & auVar28;
      auVar18 = pshuflw(auVar24,auVar19,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6560) = 0x400;
      }
      auVar18 = packssdw(auVar19,auVar19);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6562) = 0x400;
      }
      auVar18 = auVar15 ^ auVar2;
      iVar17 = auVar18._0_4_;
      iVar23 = auVar18._8_4_;
      auVar25._4_4_ = iVar17;
      auVar25._0_4_ = iVar17;
      auVar25._8_4_ = iVar23;
      auVar25._12_4_ = iVar23;
      auVar29._0_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar29._4_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar29._8_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar29._12_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar20._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar20._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar20._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar20._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar20 = auVar20 & auVar29;
      auVar18 = packssdw(auVar25,auVar20);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6564) = 0x400;
      }
      auVar18 = pshufhw(auVar20,auVar20,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6566) = 0x400;
      }
      auVar18 = auVar14 ^ auVar2;
      iVar17 = auVar18._0_4_;
      iVar23 = auVar18._8_4_;
      auVar26._4_4_ = iVar17;
      auVar26._0_4_ = iVar17;
      auVar26._8_4_ = iVar23;
      auVar26._12_4_ = iVar23;
      auVar30._0_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar30._4_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar30._8_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar30._12_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar21._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar21._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar21._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar21._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar21 = auVar21 & auVar30;
      auVar18 = pshuflw(auVar26,auVar21,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x6568) = 0x400;
      }
      auVar18 = packssdw(auVar21,auVar21);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x656a) = 0x400;
      }
      auVar18 = auVar13 ^ auVar2;
      iVar17 = auVar18._0_4_;
      iVar23 = auVar18._8_4_;
      auVar27._4_4_ = iVar17;
      auVar27._0_4_ = iVar17;
      auVar27._8_4_ = iVar23;
      auVar27._12_4_ = iVar23;
      auVar31._0_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar31._4_4_ = -(uint)(iVar17 < -0x7fffff8e);
      auVar31._8_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar31._12_4_ = -(uint)(iVar23 < -0x7fffff8e);
      auVar22._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar31;
      auVar18 = packssdw(auVar27,auVar22);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x656c) = 0x400;
      }
      auVar18 = pshufhw(auVar22,auVar22,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)coder_ptr + lVar5 * 2 + 0x656e) = 0x400;
      }
      lVar5 = lVar5 + 8;
      lVar4 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar4 + 8;
      lVar4 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar4 + 8;
      lVar4 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar4 + 8;
      lVar4 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar4 + 8;
    } while (lVar5 != 0x78);
    *(undefined8 *)((long)coder_ptr + 0x6644) = 0x400040004000400;
    *(undefined8 *)((long)coder_ptr + 0x664c) = 0x400040004000400;
    *(undefined8 *)((long)coder_ptr + 0x6654) = 0x400040004000400;
    *(undefined8 *)((long)coder_ptr + 0x665c) = 0x400040004000400;
    *(undefined4 *)((long)coder_ptr + 0x6664) = 0x4000400;
    *(undefined4 *)((long)coder_ptr + 0x6a68) = 0x4000400;
    uVar11 = 1;
    do {
      lVar5 = (ulong)(uVar11 - 1) * 0x10;
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 + 0x6668);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 + 0x6768);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 + 0x6a6c);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 + 0x6b6c);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      uVar8 = uVar11 >> (bVar3 & 0x1f);
      uVar11 = uVar11 + 1;
    } while (uVar8 == 0);
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 * 2 + 0x6868);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)coder_ptr + lVar5 * 2 + 0x6c6c);
      *puVar1 = 0x400040004000400;
      puVar1[1] = 0x400040004000400;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x100);
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
    *(undefined1 (*) [16])((long)coder_ptr + 0x6ea8) = (undefined1  [16])0x0;
    *(undefined8 *)((long)coder_ptr + 0x6eb8) = 0;
    return;
  }
  __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                ,0x85,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
}

Assistant:

static void
lzma_decoder_reset(void *coder_ptr, const void *opt)
{
	lzma_lzma1_decoder *coder = coder_ptr;
	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (uint32_t i = 0; i < STATES; ++i) {
		for (uint32_t j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (uint32_t i = 0; i < DIST_STATES; ++i)
		bittree_reset(coder->dist_slot[i], DIST_SLOT_BITS);

	for (uint32_t i = 0; i < FULL_DISTANCES - DIST_MODEL_END; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	const uint32_t num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (uint32_t pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}